

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.h
# Opt level: O1

Node<NimState> * __thiscall
MCTS::Node<NimState>::add_child(Node<NimState> *this,Move *move,NimState *state)

{
  pointer *pppNVar1;
  int iVar2;
  iterator __position;
  int *piVar3;
  pointer piVar4;
  Node<NimState> *pNVar5;
  int *piVar6;
  bool bVar7;
  Node<NimState> *node;
  Node<NimState> *local_28;
  
  pNVar5 = (Node<NimState> *)operator_new(0x60);
  pNVar5->move = *move;
  pNVar5->parent = this;
  pNVar5->player_to_move = state->player_to_move;
  pNVar5->wins = 0.0;
  pNVar5->visits = 0;
  NimState::get_moves(&pNVar5->moves,state);
  (pNVar5->children).
  super__Vector_base<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pNVar5->UCT_score = 0.0;
  (pNVar5->children).
  super__Vector_base<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pNVar5->children).
  super__Vector_base<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __position._M_current =
       (this->children).
       super__Vector_base<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_28 = pNVar5;
  if (__position._M_current ==
      (this->children).
      super__Vector_base<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<MCTS::Node<NimState>*,std::allocator<MCTS::Node<NimState>*>>::
    _M_realloc_insert<MCTS::Node<NimState>*const&>
              ((vector<MCTS::Node<NimState>*,std::allocator<MCTS::Node<NimState>*>> *)
               &this->children,__position,&local_28);
  }
  else {
    *__position._M_current = pNVar5;
    pppNVar1 = &(this->children).
                super__Vector_base<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  if ((this->children).
      super__Vector_base<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->children).
      super__Vector_base<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    assertion_failed("! children.empty()",
                     "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/mcts.h"
                     ,0xf2);
  }
  piVar6 = (this->moves).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (this->moves).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar7 = piVar6 == piVar3;
  if (!bVar7) {
    iVar2 = *piVar6;
    while (iVar2 != *move) {
      piVar6 = piVar6 + 1;
      bVar7 = piVar6 == piVar3;
      if (bVar7) goto LAB_0010b5e2;
      iVar2 = *piVar6;
    }
    if (!bVar7) {
      piVar4 = (this->moves).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      iVar2 = *piVar6;
      *piVar6 = piVar4[-1];
      piVar4[-1] = iVar2;
      std::vector<int,_std::allocator<int>_>::resize
                (&this->moves,
                 ((long)piVar4 -
                  (long)(this->moves).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) - 1);
      return local_28;
    }
  }
LAB_0010b5e2:
  assertion_failed("itr != moves.end()",
                   "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/mcts.h"
                   ,0xf6);
}

Assistant:

Node<State>* Node<State>::add_child(const Move& move, const State& state)
{
	auto node = new Node(state, move, this);
	children.push_back(node);
	attest( ! children.empty());

	auto itr = moves.begin();
	for (; itr != moves.end() && *itr != move; ++itr);
	attest(itr != moves.end());
	std::iter_swap(itr, moves.end() - 1);
	moves.resize(moves.size() - 1);
	return node;
}